

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O2

void __thiscall RefCount::Ptr<TestObject>::~Ptr(Ptr<TestObject> *this)

{
  usize *puVar1;
  
  if (this->refObj != (Object *)0x0) {
    LOCK();
    puVar1 = &this->refObj->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (this->refObj != (Object *)0x0)) {
      (*this->refObj->_vptr_Object[1])();
      return;
    }
  }
  return;
}

Assistant:

~Ptr()
    {
      if(refObj && Atomic::decrement(refObj->ref) == 0)
        delete refObj;
    }